

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  container_t *c;
  uint8_t type;
  _Bool _Var1;
  uint uVar2;
  container_t *c_00;
  ulong uVar3;
  ulong uVar4;
  uint16_t x;
  size_t i;
  size_t sVar5;
  uint8_t new_typecode;
  uint32_t *local_40;
  size_t local_38;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    uVar4 = 0xffffffffffffffff;
    local_40 = vals;
    local_38 = n_args;
    for (sVar5 = 0; local_38 != sVar5; sVar5 = sVar5 + 1) {
      uVar2 = vals[sVar5];
      x = (uint16_t)(uVar2 >> 0x10);
      if (((int)uVar4 < 0) ||
         (uVar3 = uVar4 & 0xffffffff, uVar2 >> 0x10 != (uint)(r->high_low_container).keys[uVar3])) {
        uVar2 = ra_get_index(&r->high_low_container,x);
        uVar3 = (ulong)uVar2;
        uVar4 = uVar3;
        if (-1 < (int)uVar2) {
          uVar2 = vals[sVar5];
          goto LAB_001045c1;
        }
      }
      else {
LAB_001045c1:
        c_00 = container_remove((r->high_low_container).containers[uVar3],(uint16_t)uVar2,
                                (r->high_low_container).typecodes[uVar3],&new_typecode);
        c = (r->high_low_container).containers[uVar3];
        if (c_00 != c) {
          container_free(c,(r->high_low_container).typecodes[uVar3]);
          (r->high_low_container).keys[uVar3] = x;
          (r->high_low_container).containers[uVar3] = c_00;
          (r->high_low_container).typecodes[uVar3] = new_typecode;
        }
        type = new_typecode;
        _Var1 = container_nonzero_cardinality(c_00,new_typecode);
        vals = local_40;
        if (!_Var1) {
          container_free(c_00,type);
          ra_remove_at_index(&r->high_low_container,(int32_t)uVar4);
          uVar4 = 0xffffffffffffffff;
          vals = local_40;
        }
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos =
        -1;  // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(
                r->high_low_container.containers[pos], vals[i] & 0xffff,
                r->high_low_container.typecodes[pos], &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}